

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O3

void m68k_op_scs_8_pi7(void)

{
  uint uVar1;
  uint addr_in;
  
  uVar1 = m68ki_cpu.c_flag;
  addr_in = m68ki_cpu.dar[0xf];
  m68ki_cpu.dar[0xf] = m68ki_cpu.dar[0xf] + 2;
  my_fc_handler(m68ki_cpu.s_flag | 1);
  if (m68ki_cpu.pmmu_enabled != 0) {
    addr_in = pmmu_translate_addr(addr_in);
  }
  m68k_write_memory_8(addr_in & m68ki_cpu.address_mask,(int)(uVar1 << 0x17) >> 0x1f & 0xff);
  return;
}

Assistant:

static void m68k_op_scs_8_pi7(void)
{
	m68ki_write_8(EA_A7_PI_8(), COND_CS() ? 0xff : 0);
}